

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  int iVar2;
  Task<int> task;
  undefined1 local_d8 [8];
  ThreadPool<int> pool;
  
  ThreadPool<int>::ThreadPool((ThreadPool<int> *)local_d8,3,10);
  iVar2 = 100;
  do {
    piVar1 = (int *)operator_new(4);
    *piVar1 = iVar2;
    task.arg = piVar1;
    task.functions = taskFunc;
    ThreadPool<int>::addTask((ThreadPool<int> *)local_d8,task);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 200);
  sleep(0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------exit---------------\n",0x1b);
  ThreadPool<int>::~ThreadPool((ThreadPool<int> *)local_d8);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    // 创建线程池
    ThreadPool<int> pool(3, 10);

    for (int i = 0; i < 100; i++)
    {
        int *num = new int(i + 100);

        pool.addTask(Task<int>(taskFunc, num));

    }

    sleep(30);  // 睡眠30秒

    cout<<"-------exit---------------\n";

    return 0;
}